

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::FboCases::SharedDepthbufferTest::render
          (SharedDepthbufferTest *this,Context *context,Surface *dst)

{
  GLenum GVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  _func_int **pp_Var5;
  int in_R9D;
  ulong uVar6;
  FboConfig *config;
  Vec3 local_378;
  Vec3 local_36c;
  Surface *local_360;
  Framebuffer fboA;
  Framebuffer fboB;
  FboConfig cfg;
  FlatColorShader colorShader;
  SingleTex2DShader texShader;
  
  SingleTex2DShader::SingleTex2DShader(&texShader);
  FlatColorShader::FlatColorShader(&colorShader);
  uVar2 = (*context->_vptr_Context[0x75])(context,&texShader);
  uVar3 = (*context->_vptr_Context[0x75])(context,&colorShader);
  GVar1 = (this->super_FboRenderCase).m_config.stencilbufferType;
  (*context->_vptr_Context[0x76])(context,(ulong)uVar2);
  uVar4 = (*context->_vptr_Context[0x66])(context,(ulong)uVar2,"u_sampler0");
  (*context->_vptr_Context[0x5b])(context,(ulong)uVar4,0);
  fboA.m_config.colorbufferType = 0;
  fboA.m_config.colorbufferFormat = 0x3f800000;
  fboA.m_config.depthbufferType = 0;
  fboA.m_config.depthbufferFormat = 0x3f800000;
  local_360 = dst;
  (*context->_vptr_Context[0x76])(context,(ulong)uVar3);
  uVar4 = (*context->_vptr_Context[0x66])(context,(ulong)uVar3,"u_color");
  (*context->_vptr_Context[0x5f])(context,(ulong)uVar4,1,&fboA);
  createMetaballsTex2D(context,5,0x1907,0x40,0x40,in_R9D);
  createQuadsTex2D(context,6,0x1907,0x40,0x40,in_R9D);
  (*context->_vptr_Context[5])(context,0,0,0x80,0x80);
  config = &(this->super_FboRenderCase).m_config;
  Framebuffer::Framebuffer(&fboA,context,config,0x80,0x80,0,0,0,0);
  Framebuffer::checkCompleteness(&fboA);
  cfg.colorbufferType = config->colorbufferType;
  cfg.colorbufferFormat = config->colorbufferFormat;
  cfg.stencilbufferType = (this->super_FboRenderCase).m_config.stencilbufferType;
  cfg.stencilbufferFormat = (this->super_FboRenderCase).m_config.stencilbufferFormat;
  cfg.depthbufferType = 0;
  cfg.depthbufferFormat = 0;
  Framebuffer::Framebuffer(&fboB,context,&cfg,0x80,0x80,0,0,0,0);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)fboB.m_framebuffer);
  (*context->_vptr_Context[0x20])(context,0x8d40,0x8d00,0x8d41,(ulong)fboA.m_depthbuffer);
  (*context->_vptr_Context[0x2a])(0x3f800000,0,0,0x3f800000,context);
  (*context->_vptr_Context[0x2c])(context,1);
  (*context->_vptr_Context[0x2d])(context,0x4500);
  (*context->_vptr_Context[0x33])(context,0xb71);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)fboA.m_framebuffer);
  (*context->_vptr_Context[6])(context,0xde1,6);
  (*context->_vptr_Context[0x2a])(0,0,0,0x3f800000,context);
  (*context->_vptr_Context[0x2d])(context,0x4500);
  local_36c.m_data[0] = -1.0;
  local_36c.m_data[1] = -1.0;
  local_36c.m_data[2] = 0.0;
  local_378.m_data._0_8_ = &DAT_3f8000003f800000;
  local_378.m_data[2] = 0.0;
  sglr::drawQuad(context,uVar2,&local_36c,&local_378);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)fboB.m_framebuffer);
  (*context->_vptr_Context[6])(context,0xde1,5);
  local_36c.m_data[0] = -1.0;
  local_36c.m_data[1] = -1.0;
  local_36c.m_data[2] = -1.0;
  local_378.m_data._0_8_ = &DAT_3f8000003f800000;
  local_378.m_data[2] = 1.0;
  sglr::drawQuad(context,uVar2,&local_36c,&local_378);
  (*context->_vptr_Context[0x34])(context,0xb71);
  if (GVar1 != 0) {
    (*context->_vptr_Context[0x33])(context,0xc11);
    (*context->_vptr_Context[0x32])(context,10,10,0xc,0x19);
    (*context->_vptr_Context[0x2c])(context,0);
    (*context->_vptr_Context[0x2d])(context,0x400);
    (*context->_vptr_Context[0x34])(context,0xc11);
    (*context->_vptr_Context[0x33])(context,0xb90);
    (*context->_vptr_Context[0x35])(context,0x202,0,0xff);
    local_36c.m_data[0] = -1.0;
    local_36c.m_data[1] = -1.0;
    local_36c.m_data[2] = 0.0;
    local_378.m_data._0_8_ = &DAT_3f8000003f800000;
    local_378.m_data[2] = 0.0;
    sglr::drawQuad(context,uVar3,&local_36c,&local_378);
    (*context->_vptr_Context[0x34])(context,0xb90);
  }
  pp_Var5 = context->_vptr_Context;
  uVar3 = 0x80;
  if (config->colorbufferType == 0xde1) {
    (*pp_Var5[9])(context,0x8d40,0);
    uVar3 = (*context->_vptr_Context[2])(context);
    uVar4 = (*context->_vptr_Context[3])(context);
    (*context->_vptr_Context[5])(context,0,0,(ulong)uVar3,(ulong)uVar4);
    (*context->_vptr_Context[6])(context,0xde1,(ulong)fboA.m_colorbuffer);
    local_36c.m_data[0] = -1.0;
    local_36c.m_data[1] = -1.0;
    local_36c.m_data[2] = 0.0;
    local_378.m_data[0] = 0.0;
    local_378.m_data[1] = 1.0;
    local_378.m_data[2] = 0.0;
    sglr::drawQuad(context,uVar2,&local_36c,&local_378);
    (*context->_vptr_Context[6])(context,0xde1,(ulong)fboB.m_colorbuffer);
    local_36c.m_data[0] = 0.0;
    local_36c.m_data[1] = -1.0;
    local_36c.m_data[2] = 0.0;
    local_378.m_data._0_8_ = &DAT_3f8000003f800000;
    local_378.m_data[2] = 0.0;
    sglr::drawQuad(context,uVar2,&local_36c,&local_378);
    uVar3 = (*context->_vptr_Context[2])(context);
    uVar2 = (*context->_vptr_Context[3])(context);
    uVar6 = (ulong)uVar2;
    pp_Var5 = context->_vptr_Context;
  }
  else {
    uVar6 = 0x80;
  }
  (*pp_Var5[0x80])(context,local_360,0,0,(ulong)uVar3,uVar6);
  Framebuffer::~Framebuffer(&fboB);
  Framebuffer::~Framebuffer(&fboA);
  sglr::ShaderProgram::~ShaderProgram(&colorShader.super_ShaderProgram);
  sglr::ShaderProgram::~ShaderProgram(&texShader.super_ShaderProgram);
  return;
}

Assistant:

void SharedDepthbufferTest::render (sglr::Context& context, Surface& dst)
{
	SingleTex2DShader	texShader;
	FlatColorShader		colorShader;
	deUint32			texShaderID		= context.createProgram(&texShader);
	deUint32			colorShaderID	= context.createProgram(&colorShader);
	int					width			= 128;
	int					height			= 128;
	bool				stencil			= getConfig().stencilbufferType != GL_NONE;

	// Setup shaders
	texShader.setUnit(context, texShaderID, 0);
	colorShader.setColor(context, colorShaderID, Vec4(0.0f, 1.0f, 0.0f, 1.0f));

	// Textures
	deUint32 metaballsTex	= 5;
	deUint32 quadsTex		= 6;
	createMetaballsTex2D(context, metaballsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);
	createQuadsTex2D(context, quadsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);

	context.viewport(0, 0, width, height);

	// Fbo A
	Framebuffer fboA(context, getConfig(), width, height);
	fboA.checkCompleteness();

	// Fbo B
	FboConfig cfg = getConfig();
	cfg.depthbufferType		= GL_NONE;
	cfg.depthbufferFormat	= GL_NONE;
	Framebuffer fboB(context, cfg, width, height);

	// Bind depth buffer from fbo A to fbo B
	DE_ASSERT(fboA.getConfig().depthbufferType == GL_RENDERBUFFER);
	context.bindFramebuffer(GL_FRAMEBUFFER, fboB.getFramebuffer());
	context.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, fboA.getDepthbuffer());

	// Clear fbo B color to red and stencil to 1
	context.clearColor(1.0f, 0.0f, 0.0f, 1.0f);
	context.clearStencil(1);
	context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	// Enable depth test.
	context.enable(GL_DEPTH_TEST);

	// Render quad to fbo A
	context.bindFramebuffer(GL_FRAMEBUFFER, fboA.getFramebuffer());
	context.bindTexture(GL_TEXTURE_2D, quadsTex);
	context.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	sglr::drawQuad(context, texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

	// Render metaballs to fbo B
	context.bindFramebuffer(GL_FRAMEBUFFER, fboB.getFramebuffer());
	context.bindTexture(GL_TEXTURE_2D, metaballsTex);
	sglr::drawQuad(context, texShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

	context.disable(GL_DEPTH_TEST);

	if (stencil)
	{
		// Clear subset of stencil buffer to 0
		context.enable(GL_SCISSOR_TEST);
		context.scissor(10, 10, 12, 25);
		context.clearStencil(0);
		context.clear(GL_STENCIL_BUFFER_BIT);
		context.disable(GL_SCISSOR_TEST);

		// Render quad with stencil mask == 0
		context.enable(GL_STENCIL_TEST);
		context.stencilFunc(GL_EQUAL, 0, 0xffu);
		sglr::drawQuad(context, colorShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		context.disable(GL_STENCIL_TEST);
	}

	if (getConfig().colorbufferType == GL_TEXTURE_2D)
	{
		// Render both to screen
		context.bindFramebuffer(GL_FRAMEBUFFER, 0);
		context.viewport(0, 0, context.getWidth(), context.getHeight());
		context.bindTexture(GL_TEXTURE_2D, fboA.getColorbuffer());
		sglr::drawQuad(context, texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(0.0f, 1.0f, 0.0f));
		context.bindTexture(GL_TEXTURE_2D, fboB.getColorbuffer());
		sglr::drawQuad(context, texShaderID, Vec3(0.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		context.readPixels(dst, 0, 0, context.getWidth(), context.getHeight());
	}
	else
	{
		// Read results from fbo B
		context.readPixels(dst, 0, 0, width, height);
	}
}